

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

int Cof_ManSuppSize_rec(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  int iVar1;
  bool bVar2;
  int local_30;
  uint local_2c;
  uint Counter;
  uint i;
  Cof_Obj_t *pNext;
  Cof_Obj_t *pObj_local;
  Cof_Man_t *p_local;
  
  local_30 = 0;
  iVar1 = Cof_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Cof_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Cof_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Cof_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Cof_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCof.c"
                      ,0x148,"int Cof_ManSuppSize_rec(Cof_Man_t *, Cof_Obj_t *)");
      }
      local_2c = 0;
      while( true ) {
        bVar2 = false;
        if (local_2c < (*(uint *)pObj >> 4 & 0xf)) {
          _Counter = Cof_ObjFanin(pObj,local_2c);
          bVar2 = _Counter != (Cof_Obj_t *)0x0;
        }
        if (!bVar2) break;
        iVar1 = Cof_ManSuppSize_rec(p,_Counter);
        local_30 = iVar1 + local_30;
        local_2c = local_2c + 1;
      }
      p_local._4_4_ = local_30;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Cof_ManSuppSize_rec( Cof_Man_t * p, Cof_Obj_t * pObj )
{
    Cof_Obj_t * pNext;
    unsigned i, Counter = 0;
    if ( Cof_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Cof_ObjSetTravIdCurrent(p, pObj);
    if ( Cof_ObjIsCi(pObj) )
        return 1;
    assert( Cof_ObjIsNode(pObj) );
    Cof_ObjForEachFanin( pObj, pNext, i )
        Counter += Cof_ManSuppSize_rec( p, pNext );
    return Counter;
}